

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image-util.cc
# Opt level: O1

bool tinyusdz::srgb_f32_to_linear_f32
               (vector<float,_std::allocator<float>_> *in_img,size_t width,size_t height,
               size_t channels,size_t channel_stride,vector<float,_std::allocator<float>_> *out_img,
               float scale_factor,float bias,float alpha_scale_factor,float alpha_bias,string *err)

{
  pointer pfVar1;
  pointer pfVar2;
  size_t c;
  ostream *poVar3;
  pointer pcVar4;
  undefined8 unaff_RBP;
  long lVar5;
  char *pcVar6;
  long lVar7;
  size_t x;
  long lVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  size_t dest_size;
  ostringstream ss_e;
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  long local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  pointer local_228;
  undefined4 local_220;
  float local_21c;
  long local_218;
  size_t local_210;
  long local_208;
  long local_200;
  long local_1f8;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  undefined1 local_1d8 [8];
  undefined8 *local_1d0;
  undefined8 local_1c0 [2];
  unsigned_long local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_260._0_8_ = channel_stride;
  local_228 = (pointer)channels;
  local_21c = alpha_bias;
  if (width == 0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
               ,0x54);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"srgb_f32_to_linear_f32",0x16);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,0x1da);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    pcVar6 = "width is zero.";
    lVar7 = 0xe;
LAB_004687bd:
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,lVar7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    if (err == (string *)0x0) goto LAB_0046881c;
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)err,local_250._8_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._8_8_ == &local_238) goto LAB_0046881c;
  }
  else {
    if (height == 0) {
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                 ,0x54);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"srgb_f32_to_linear_f32",0x16);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,0x1de);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      pcVar6 = "height is zero.";
      lVar7 = 0xf;
      goto LAB_004687bd;
    }
    if (channels == 0) {
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                 ,0x54);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"srgb_f32_to_linear_f32",0x16);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,0x1e2);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      pcVar6 = "channels is zero.";
      lVar7 = 0x11;
      goto LAB_004687bd;
    }
    if (out_img == (vector<float,_std::allocator<float>_> *)0x0) {
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                 ,0x54);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"srgb_f32_to_linear_f32",0x16);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,0x1e6);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      pcVar6 = "`out_img` is nullptr.";
      lVar7 = 0x15;
      goto LAB_004687bd;
    }
    local_260._0_8_ = channels;
    if ((channel_stride == 0) || (local_260._0_8_ = channel_stride, channels <= channel_stride)) {
      local_1d8 = (undefined1  [8])(height * width * local_260._0_8_);
      pcVar4 = (pointer)((long)(in_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)(in_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                               super__Vector_impl_data._M_start >> 2);
      bVar9 = (long)local_1d8 - (long)pcVar4 == 0;
      local_220 = (undefined4)
                  CONCAT71((int7)((ulong)unaff_RBP >> 8),(ulong)local_1d8 < pcVar4 || bVar9);
      if ((ulong)local_1d8 < pcVar4 || bVar9) {
        local_260._12_4_ = scale_factor;
        local_250._0_4_ = bias;
        local_250._4_4_ = alpha_scale_factor;
        ::std::vector<float,_std::allocator<float>_>::resize(out_img,(size_type)local_1d8);
        local_1e8 = width + (width == 0);
        local_208 = height + (height == 0);
        local_218 = width * 4;
        local_1e0 = 0;
        lVar7 = 0;
        local_200 = 0;
        fVar12 = (float)local_250._4_4_;
        fVar13 = (float)local_250._0_4_;
        fVar14 = (float)local_260._12_4_;
        local_210 = width;
        do {
          lVar8 = 0;
          local_1f8 = lVar7;
          local_1f0 = local_1e0;
          do {
            if (local_228 != (pointer)0x0) {
              pcVar4 = (pointer)0x0;
              do {
                lVar5 = local_260._0_8_ * lVar7;
                fVar10 = (in_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                         super__Vector_impl_data._M_start[(long)(pcVar4 + lVar5)] * fVar14 + fVar13;
                fVar11 = 0.0;
                if ((0.0 < fVar10) && (fVar11 = 1.0, fVar10 < 1.0)) {
                  if (0.04045 <= fVar10) {
                    fVar11 = powf((fVar10 + 0.055) / 1.055,2.4);
                    fVar12 = (float)local_250._4_4_;
                    fVar13 = (float)local_250._0_4_;
                    fVar14 = (float)local_260._12_4_;
                  }
                  else {
                    fVar11 = fVar10 / 12.92;
                  }
                }
                (out_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start[(long)(pcVar4 + lVar5)] = fVar11;
                pcVar4 = pcVar4 + 1;
              } while (pcVar4 < local_228);
            }
            if (local_228 < (ulong)local_260._0_8_) {
              pfVar1 = (out_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              pfVar2 = (in_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              pcVar4 = local_228;
              do {
                *(float *)((long)pfVar1 + (long)pcVar4 * 4 + local_260._0_8_ * local_1e0) =
                     *(float *)((long)pfVar2 + (long)pcVar4 * 4 + local_260._0_8_ * local_1e0) *
                     fVar12 + local_21c;
                pcVar4 = pcVar4 + 1;
              } while ((pointer)local_260._0_8_ != pcVar4);
            }
            lVar8 = lVar8 + 1;
            lVar7 = lVar7 + 1;
            local_1e0 = local_1e0 + 4;
          } while (lVar8 != local_1e8);
          local_200 = local_200 + 1;
          lVar7 = local_1f8 + local_210;
          local_1e0 = local_1f0 + local_218;
        } while (local_200 != local_208);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                   ,0x54);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"srgb_f32_to_linear_f32",0x16);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,499);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        local_1d0 = local_1c0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1d0,
                   "Insufficient input buffer size. must be the same or larger than {} but has {}",
                   "");
        local_1b0 = (long)(in_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(in_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                          super__Vector_impl_data._M_start >> 2;
        fmt::format<unsigned_long,unsigned_long>
                  ((string *)(local_250 + 8),(fmt *)&local_1d0,(string *)local_1d8,&local_1b0,
                   (unsigned_long *)channel_stride);
        poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)local_250._8_8_,local_240);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._8_8_ != &local_238) {
          operator_delete((void *)local_250._8_8_,local_238._M_allocated_capacity + 1);
        }
        if (local_1d0 != local_1c0) {
          operator_delete(local_1d0,local_1c0[0] + 1);
        }
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)err,local_250._8_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._8_8_ != &local_238) {
            operator_delete((void *)local_250._8_8_,local_238._M_allocated_capacity + 1);
          }
        }
        ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
        ::std::ios_base::~ios_base(local_138);
      }
      return (bool)(char)local_220;
    }
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
               ,0x54);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"srgb_f32_to_linear_f32",0x16);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,0x1ed);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    local_1d0 = local_1c0;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1d0,"channel_stride {} is smaller than input channels {}","");
    fmt::format<unsigned_long,unsigned_long>
              ((string *)(local_250 + 8),(fmt *)&local_1d0,(string *)local_260,
               (unsigned_long *)&local_228,(unsigned_long *)channel_stride);
    poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_250._8_8_,local_240);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._8_8_ != &local_238) {
      operator_delete((void *)local_250._8_8_,local_238._M_allocated_capacity + 1);
    }
    if (local_1d0 != local_1c0) {
      operator_delete(local_1d0,local_1c0[0] + 1);
    }
    if (err == (string *)0x0) goto LAB_0046881c;
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)err,local_250._8_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._8_8_ == &local_238) goto LAB_0046881c;
  }
  operator_delete((void *)local_250._8_8_,local_238._M_allocated_capacity + 1);
LAB_0046881c:
  ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  ::std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool srgb_f32_to_linear_f32(const std::vector<float> &in_img, size_t width,
                         size_t height,
                         size_t channels, size_t channel_stride,
                         std::vector<float> *out_img, const float scale_factor, const float bias, const float alpha_scale_factor, const float alpha_bias, std::string *err) {

  if (width == 0) {
    PUSH_ERROR_AND_RETURN("width is zero.");
  }

  if (height == 0) {
    PUSH_ERROR_AND_RETURN("height is zero.");
  }

  if (channels == 0) {
    PUSH_ERROR_AND_RETURN("channels is zero.");
  }

  if (out_img == nullptr) {
    PUSH_ERROR_AND_RETURN("`out_img` is nullptr.");
  }

  if (channel_stride == 0) {
    channel_stride = channels;
  } else {
    if (channel_stride < channels) {
      PUSH_ERROR_AND_RETURN(fmt::format("channel_stride {} is smaller than input channels {}", channel_stride, channels));
    }
  }

  size_t dest_size = size_t(width) * size_t(height) * channel_stride;
  if (dest_size > in_img.size()) {
    PUSH_ERROR_AND_RETURN(fmt::format("Insufficient input buffer size. must be the same or larger than {} but has {}", dest_size, in_img.size()));
  }

  out_img->resize(dest_size);

  // assume input is in [0.0, 1.0]
  for (size_t y = 0; y < height; y++) {
    for (size_t x = 0; x < width; x++) {
      for (size_t c = 0; c < channels; c++) {
        size_t idx = channel_stride * width * y + channel_stride * x + c;
        float f = in_img[idx] * scale_factor + bias;
        (*out_img)[idx] = SrgbTransform::srgbToLinear(f);
      }

      // remainder(usually alpha channel)
      // Apply linear conversion.
      for (size_t c = channels; c < channel_stride; c++) {
        size_t idx = channel_stride * width * y + channel_stride * x + c;
        float f = in_img[idx] * alpha_scale_factor + alpha_bias;
        (*out_img)[idx] = f;
      }
    }
  }

  return true;
}